

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.hpp
# Opt level: O2

deUint8 tcu::floatToU8(float fv)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0x7e - ((int)fv >> 0x17);
  uVar1 = (((uint)fv & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar2 & 0x1f)) + 0x800000;
  if (8 < uVar2) {
    uVar1 = uVar2;
  }
  return (deUint8)(uVar1 >> 0x18);
}

Assistant:

inline deUint8 floatToU8 (float fv)
{
	union { float fv; deUint32 uv; deInt32 iv; } v;
	v.fv = fv;

	const deUint32	e	= (deUint32)(126-(v.iv>>23));
	deUint32		m	= v.uv;

	m &= 0x00ffffffu;
	m |= 0x00800000u;
	m  = (m << 8) - m;
	m  = 0x00800000u + (m >> e);

	if (e > 8)
		m = e;

	return (deUint8)(m>>24);
}